

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int decompose_f3_ext_stem_d1
              (vrna_fold_compound_t *fc,int i,vrna_callback_hc_evaluate *evaluate,
              default_data *hc_dat_local,sc_wrapper_f3 *sc_wrapper)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_94;
  int local_90;
  int local_8c;
  int local_7c;
  int local_78;
  int local_74;
  int local_64;
  int local_60;
  int local_5c;
  int maxdist;
  int *stems;
  int ee;
  int e;
  int length;
  sc_wrapper_f3 *sc_wrapper_local;
  default_data *hc_dat_local_local;
  vrna_callback_hc_evaluate *evaluate_local;
  int i_local;
  vrna_fold_compound_t *fc_local;
  
  uVar1 = fc->length;
  iVar2 = fc->window_size;
  piVar3 = f3_get_stem_contributions_d0(fc,i,evaluate,hc_dat_local,sc_wrapper);
  if ((int)(uVar1 - 1) < i + iVar2) {
    local_5c = uVar1 - 1;
  }
  else {
    local_5c = i + iVar2;
  }
  local_60 = decompose_f3_ext_stem(fc,i,local_5c,piVar3);
  stems._4_4_ = local_60;
  if ((int)uVar1 <= i + iVar2) {
    if (piVar3[(int)uVar1] <= local_60) {
      local_60 = piVar3[(int)uVar1];
    }
    stems._4_4_ = local_60;
  }
  free(piVar3 + i);
  if (stems._4_4_ < 0x989681) {
    local_64 = stems._4_4_;
  }
  else {
    local_64 = 10000000;
  }
  piVar3 = f3_get_stem_contributions_d3(fc,i,evaluate,hc_dat_local,sc_wrapper);
  if ((int)(uVar1 - 1) < i + iVar2 + 1) {
    local_74 = uVar1 - 1;
  }
  else {
    local_74 = i + iVar2 + 1;
  }
  local_78 = decompose_f3_ext_stem(fc,i,local_74,piVar3);
  stems._4_4_ = local_78;
  if ((int)uVar1 <= i + iVar2) {
    if (piVar3[(int)uVar1] <= local_78) {
      local_78 = piVar3[(int)uVar1];
    }
    stems._4_4_ = local_78;
  }
  free(piVar3 + i);
  if (local_64 < stems._4_4_) {
    local_7c = local_64;
  }
  else {
    local_7c = stems._4_4_;
  }
  piVar3 = f3_get_stem_contributions_d5(fc,i,evaluate,hc_dat_local,sc_wrapper);
  if ((int)(uVar1 - 1) < i + iVar2 + 1) {
    local_8c = uVar1 - 1;
  }
  else {
    local_8c = i + iVar2 + 1;
  }
  local_90 = decompose_f3_ext_stem(fc,i,local_8c,piVar3);
  stems._4_4_ = local_90;
  if ((int)uVar1 <= i + iVar2) {
    if (piVar3[(int)uVar1] <= local_90) {
      local_90 = piVar3[(int)uVar1];
    }
    stems._4_4_ = local_90;
  }
  free(piVar3 + i);
  if (local_7c < stems._4_4_) {
    local_94 = local_7c;
  }
  else {
    local_94 = stems._4_4_;
  }
  piVar3 = f3_get_stem_contributions_d53(fc,i,evaluate,hc_dat_local,sc_wrapper);
  if ((int)(uVar1 - 1) < i + iVar2 + 1) {
    local_a4 = uVar1 - 1;
  }
  else {
    local_a4 = i + iVar2 + 1;
  }
  local_a8 = decompose_f3_ext_stem(fc,i,local_a4,piVar3);
  stems._4_4_ = local_a8;
  if ((int)uVar1 <= i + iVar2) {
    if (piVar3[(int)uVar1] <= local_a8) {
      local_a8 = piVar3[(int)uVar1];
    }
    stems._4_4_ = local_a8;
  }
  free(piVar3 + i);
  if (local_94 < stems._4_4_) {
    local_ac = local_94;
  }
  else {
    local_ac = stems._4_4_;
  }
  return local_ac;
}

Assistant:

int
decompose_f3_ext_stem_d1(vrna_fold_compound_t       *fc,
                         int                        i,
                         vrna_callback_hc_evaluate  *evaluate,
                         struct default_data        *hc_dat_local,
                         struct sc_wrapper_f3       *sc_wrapper)
{
  int length, e, ee, *stems, maxdist;

  length  = (int)fc->length;
  maxdist = fc->window_size;
  e       = INF;

  /* A) without dangling end contributions */

  /* 1st case, actual decompostion */
  stems = f3_get_stem_contributions_d0(fc, i, evaluate, hc_dat_local, sc_wrapper);

  ee = decompose_f3_ext_stem(fc, i, MIN2(length - 1, i + maxdist), stems);

  /* 2nd case, reduce to single stem */
  if (length <= i + maxdist)
    ee = MIN2(ee, stems[length]);

  stems += i;
  free(stems);

  e = MIN2(e, ee);

  /* B) with dangling end contribution on 3' side of stem */
  stems = f3_get_stem_contributions_d3(fc, i, evaluate, hc_dat_local, sc_wrapper);

  /* 1st case, actual decompostion */
  ee = decompose_f3_ext_stem(fc, i, MIN2(length - 1, i + maxdist + 1), stems);

  /* 2nd case, reduce to single stem */
  if (length <= i + maxdist)
    ee = MIN2(ee, stems[length]);

  stems += i;
  free(stems);

  e = MIN2(e, ee);

  /* C) with dangling end contribution on 5' side of stem */
  stems = f3_get_stem_contributions_d5(fc, i, evaluate, hc_dat_local, sc_wrapper);

  /* 1st case, actual decompostion */
  ee = decompose_f3_ext_stem(fc, i, MIN2(length - 1, i + maxdist + 1), stems);

  /* 2nd case, reduce to single stem */
  if (length <= i + maxdist)
    ee = MIN2(ee, stems[length]);

  stems += i;
  free(stems);

  e = MIN2(e, ee);

  /* D) with dangling end contribution on both sides of stem */
  stems = f3_get_stem_contributions_d53(fc, i, evaluate, hc_dat_local, sc_wrapper);

  /* 1st case, actual decompostion */
  ee = decompose_f3_ext_stem(fc, i, MIN2(length - 1, i + maxdist + 1), stems);

  /* 2nd case, reduce to single stem */
  if (length <= i + maxdist)
    ee = MIN2(ee, stems[length]);

  stems += i;
  free(stems);

  e = MIN2(e, ee);

  return e;
}